

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_0::MergingIterator::status(MergingIterator *this)

{
  Status SVar1;
  Iterator *in_RAX;
  long in_RSI;
  long lVar2;
  Status local_38;
  
  (this->super_Iterator)._vptr_Iterator = (_func_int **)0x0;
  lVar2 = -1;
  local_38.state_ = (char *)in_RAX;
  do {
    lVar2 = lVar2 + 1;
    if (*(int *)(in_RSI + 0x38) <= lVar2) {
      return (Status)(char *)this;
    }
    IteratorWrapper::status((IteratorWrapper *)&local_38);
    SVar1.state_ = local_38.state_;
    (this->super_Iterator)._vptr_Iterator = (_func_int **)local_38.state_;
    local_38.state_ = (char *)0x0;
    Status::~Status(&local_38);
  } while ((Iterator *)SVar1.state_ == (Iterator *)0x0);
  return (Status)(char *)this;
}

Assistant:

Status status() const override {
    Status status;
    for (int i = 0; i < n_; i++) {
      status = children_[i].status();
      if (!status.ok()) {
        break;
      }
    }
    return status;
  }